

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.h
# Opt level: O0

void __thiscall btSoftBody::Cluster::Cluster(Cluster *this)

{
  btVector3 *pbVar1;
  long in_RDI;
  btTransform *in_stack_ffffffffffffffa0;
  btVector3 *local_58;
  btMatrix3x3 *in_stack_ffffffffffffffb0;
  btVector3 *local_40;
  
  btAlignedObjectArray<float>::btAlignedObjectArray
            ((btAlignedObjectArray<float> *)in_stack_ffffffffffffffa0);
  btAlignedObjectArray<btSoftBody::Node_*>::btAlignedObjectArray
            ((btAlignedObjectArray<btSoftBody::Node_*> *)in_stack_ffffffffffffffa0);
  btAlignedObjectArray<btVector3>::btAlignedObjectArray
            ((btAlignedObjectArray<btVector3> *)in_stack_ffffffffffffffa0);
  btTransform::btTransform(in_stack_ffffffffffffffa0);
  btMatrix3x3::btMatrix3x3(in_stack_ffffffffffffffb0);
  btMatrix3x3::btMatrix3x3(in_stack_ffffffffffffffb0);
  btVector3::btVector3((btVector3 *)(in_RDI + 0x108));
  local_40 = (btVector3 *)(in_RDI + 0x118);
  do {
    btVector3::btVector3(local_40);
    local_40 = local_40 + 1;
  } while (local_40 != (btVector3 *)(in_RDI + 0x138));
  local_58 = (btVector3 *)(in_RDI + 0x138);
  pbVar1 = (btVector3 *)(in_RDI + 0x158);
  do {
    btVector3::btVector3(local_58);
    local_58 = local_58 + 1;
  } while (local_58 != pbVar1);
  btVector3::btVector3((btVector3 *)(in_RDI + 0x160));
  btVector3::btVector3((btVector3 *)(in_RDI + 0x170));
  *(undefined8 *)(in_RDI + 0x180) = 0;
  *(undefined4 *)(in_RDI + 0x188) = 0;
  *(undefined4 *)(in_RDI + 0x18c) = 0;
  *(undefined4 *)(in_RDI + 400) = 0;
  *(undefined4 *)(in_RDI + 0x194) = 0;
  *(undefined4 *)(in_RDI + 0x198) = 0x42c80000;
  *(undefined4 *)(in_RDI + 0x19c) = 0x3c23d70a;
  *(undefined1 *)(in_RDI + 0x1a0) = 0;
  return;
}

Assistant:

Cluster() : m_leaf(0),m_ndamping(0),m_ldamping(0),m_adamping(0),m_matching(0) 
		,m_maxSelfCollisionImpulse(100.f),
		m_selfCollisionImpulseFactor(0.01f),
		m_containsAnchor(false)
		{}